

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O0

int __thiscall
icu_63::ServiceEnumeration::clone
          (ServiceEnumeration *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UBool UVar1;
  ServiceEnumeration *this_00;
  ServiceEnumeration *local_40;
  int local_20;
  ServiceEnumeration *cl;
  ServiceEnumeration *pSStack_10;
  UErrorCode status;
  ServiceEnumeration *this_local;
  
  cl._4_4_ = U_ZERO_ERROR;
  pSStack_10 = this;
  this_00 = (ServiceEnumeration *)UMemory::operator_new((UMemory *)0xb8,(size_t)__fn);
  local_40 = (ServiceEnumeration *)0x0;
  if (this_00 != (ServiceEnumeration *)0x0) {
    ServiceEnumeration(this_00,this,(UErrorCode *)((long)&cl + 4));
    local_40 = this_00;
  }
  local_20 = (int)local_40;
  UVar1 = ::U_FAILURE(cl._4_4_);
  if (UVar1 != '\0') {
    if (local_40 != (ServiceEnumeration *)0x0) {
      (*(local_40->super_StringEnumeration).super_UObject._vptr_UObject[1])();
    }
    local_20 = 0;
  }
  return local_20;
}

Assistant:

virtual StringEnumeration *clone() const {
        UErrorCode status = U_ZERO_ERROR;
        ServiceEnumeration *cl = new ServiceEnumeration(*this, status);
        if(U_FAILURE(status)) {
            delete cl;
            cl = NULL;
        }
        return cl;
    }